

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O2

void __thiscall FMultiPatchTexture::~FMultiPatchTexture(FMultiPatchTexture *this)

{
  TexPart *pTVar1;
  FRemapTable *this_00;
  long lVar2;
  int i;
  long lVar3;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FMultiPatchTexture_007e6a50;
  Unload(this);
  if (this->Parts != (TexPart *)0x0) {
    lVar2 = 8;
    for (lVar3 = 0; pTVar1 = this->Parts, lVar3 < this->NumParts; lVar3 = lVar3 + 1) {
      this_00 = *(FRemapTable **)((long)&pTVar1->OriginX + lVar2);
      if (this_00 != (FRemapTable *)0x0) {
        FRemapTable::~FRemapTable(this_00);
        operator_delete(this_00,0x20);
      }
      lVar2 = lVar2 + 0x28;
    }
    if (pTVar1 != (TexPart *)0x0) {
      operator_delete__(pTVar1);
    }
    this->Parts = (TexPart *)0x0;
  }
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FMultiPatchTexture::~FMultiPatchTexture ()
{
	Unload ();
	if (Parts != NULL)
	{
		for(int i=0; i<NumParts;i++)
		{
			if (Parts[i].Translation != NULL) delete Parts[i].Translation;
		}
		delete[] Parts;
		Parts = NULL;
	}
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}